

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::init(CPU *this,EVP_PKEY_CTX *ctx)

{
  uint16_t uVar1;
  Console *this_00;
  Memory *this_01;
  undefined6 extraout_var;
  
  this_00 = Console::Instance();
  this_01 = Console::getMemory(this_00);
  this->m = this_01;
  Memory::Write16(this_01,8,0xf7);
  Memory::Write16(this->m,9,0xef);
  Memory::Write16(this->m,10,0xdf);
  Memory::Write16(this->m,0xf,0xbf);
  uVar1 = Memory::Read16(this->m,0xfffc);
  this->PC = uVar1;
  return (int)CONCAT62(extraout_var,uVar1);
}

Assistant:

void CPU::init() {
	Console &c = Console::Instance();
	m = c.getMemory();

	m->Write16(0x0008, 0xF7);
	m->Write16(0x0009, 0xEF);
	m->Write16(0x000A, 0xDF);
	m->Write16(0x000F, 0xBF);
	setPC(m->Read16(0xFFFC));
}